

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniDFS.cpp
# Opt level: O0

bool __thiscall NameServer::assignFetchWork(NameServer *this)

{
  bool bVar1;
  int iVar2;
  void *this_00;
  pointer ppVar3;
  ostream *poVar4;
  pointer ppVar5;
  size_type sVar6;
  reference pbVar7;
  pointer ppVar8;
  reference pvVar9;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
  local_b8;
  iterator servers;
  string local_a0 [36];
  int local_7c;
  undefined8 uStack_78;
  int blockID;
  size_type part_pos;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> b;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_50;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  _Self local_30;
  iterator all_blocks;
  _Self local_20;
  iterator fileInfo;
  NameServer *this_local;
  
  fileInfo._M_node = (_Base_ptr)this;
  if (type == fetch) {
    local_20._M_node =
         (_Base_ptr)
         std::
         map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>_>_>_>
         ::find(&fileid_path_lenMap_abi_cxx11_,&fetch_id);
    all_blocks._M_node =
         (_Base_ptr)
         std::
         map<int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>_>_>_>
         ::end(&fileid_path_lenMap_abi_cxx11_);
    bVar1 = std::operator==(&local_20,(_Self *)&all_blocks);
    if (bVar1) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"No such file with id = ");
      this_00 = (void *)std::ostream::operator<<(poVar4,fetch_id);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      return false;
    }
    ppVar3 = std::
             _Rb_tree_iterator<std::pair<const_int,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long_long>_>_>
             ::operator->(&local_20);
    std::__cxx11::string::operator=((string *)fetch_filepath_abi_cxx11_,(string *)&ppVar3->second);
  }
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
       ::find(&logicFile_BlockFileMap_abi_cxx11_,(key_type *)fetch_filepath_abi_cxx11_);
  __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                ::end(&logicFile_BlockFileMap_abi_cxx11_);
  bVar1 = std::operator==(&local_30,(_Self *)&__range1);
  if (bVar1) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"No such file with path = ");
    poVar4 = std::operator<<(poVar4,(string *)fetch_filepath_abi_cxx11_);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else {
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator->(&local_30);
    sVar6 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&ppVar5->second);
    fetch_blocks = (int)sVar6;
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator->(&local_30);
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&ppVar5->second);
    local_50._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&ppVar5->second);
    while (bVar1 = __gnu_cxx::operator!=(&__end1,&local_50), bVar1) {
      pbVar7 = __gnu_cxx::
               __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator*(&__end1);
      std::__cxx11::string::string((string *)&part_pos,(string *)pbVar7);
      uStack_78 = std::__cxx11::string::find_last_of((char *)&part_pos,0x153366);
      std::__cxx11::string::substr((ulong)local_a0,(ulong)&part_pos);
      iVar2 = std::__cxx11::stoi(local_a0,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)local_a0);
      local_7c = iVar2;
      local_b8._M_node =
           (_Base_ptr)
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::find(&block_serversMap_abi_cxx11_,(key_type *)&part_pos);
      ppVar8 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>
               ::operator->(&local_b8);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](&ppVar8->second,0);
      fetch_servers[local_7c] = *pvVar9;
      std::__cxx11::string::~string((string *)&part_pos);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool assignFetchWork() const
    {

        if (type == MsgType::fetch)
        {
            auto fileInfo = fileid_path_lenMap.find(fetch_id);
            if (fileInfo == fileid_path_lenMap.end())
            {
                cerr << "No such file with id = " << fetch_id << endl;
                return false;
            }
            fetch_filepath = fileInfo->second.first;
        }

        auto all_blocks = logicFile_BlockFileMap.find(fetch_filepath);

        if (all_blocks == logicFile_BlockFileMap.end())
        {
            cerr << "No such file with path = " << fetch_filepath << endl;
            return false;
        }

        fetch_blocks = all_blocks->second.size();

                // block_serversMap
        for (auto b : all_blocks->second)
        {
            auto part_pos = b.find_last_of("part");
            int blockID = stoi(b.substr(part_pos + 1));
            auto servers = block_serversMap.find(b);
            fetch_servers[blockID] = servers->second[0];

        }

        return true;
    }